

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O0

void __thiscall foxxll::ufs_file_base::close_remove(ufs_file_base *this)

{
  int iVar1;
  Logger *pLVar2;
  char *__filename;
  int *piVar3;
  int in_ESI;
  char *local_320;
  Logger local_318;
  LoggerVoidify local_19d [13];
  Logger local_190;
  LoggerVoidify local_11;
  ufs_file_base *local_10;
  ufs_file_base *this_local;
  
  local_10 = this;
  close(this,in_ESI);
  if ((this->is_device_ & 1U) == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    iVar1 = remove(__filename);
    if (iVar1 != 0) {
      tlx::Logger::Logger(&local_318);
      pLVar2 = tlx::Logger::operator<<(&local_318,(char (*) [24])"remove() error on path=");
      pLVar2 = tlx::Logger::operator<<(pLVar2,&this->filename_);
      pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [8])" error=");
      piVar3 = __errno_location();
      local_320 = strerror(*piVar3);
      pLVar2 = tlx::Logger::operator<<(pLVar2,&local_320);
      tlx::LoggerVoidify::operator&(local_19d,pLVar2);
      tlx::Logger::~Logger(&local_318);
    }
  }
  else {
    tlx::Logger::Logger(&local_190);
    pLVar2 = tlx::Logger::operator<<(&local_190,(char (*) [15])"remove() path=");
    pLVar2 = tlx::Logger::operator<<(pLVar2,&this->filename_);
    pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [32])" skipped as file is device node");
    tlx::LoggerVoidify::operator&(&local_11,pLVar2);
    tlx::Logger::~Logger(&local_190);
  }
  return;
}

Assistant:

void ufs_file_base::close_remove()
{
    close();

    if (is_device_) {
        TLX_LOG1 << "remove() path=" << filename_
                 << " skipped as file is device node";
        return;
    }

    if (::remove(filename_.c_str()) != 0)
        TLX_LOG1 << "remove() error on path=" << filename_
                 << " error=" << strerror(errno);
}